

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_wstring * archive_wstrncat(archive_wstring *as,wchar_t *p,size_t n)

{
  archive_wstring *paVar1;
  ulong in_RDX;
  archive_wstring *in_RSI;
  bool bVar2;
  wchar_t *pp;
  size_t s;
  size_t in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    bVar2 = false;
    if (uVar3 < in_RDX) {
      bVar2 = *(int *)&in_RSI->s != 0;
    }
    if (!bVar2) break;
    in_RSI = (archive_wstring *)((long)&in_RSI->s + 4);
    uVar3 = uVar3 + 1;
  }
  paVar1 = archive_wstring_append
                     (in_RSI,(wchar_t *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (paVar1 == (archive_wstring *)0x0) {
    __archive_errx((int)(uVar3 >> 0x20),(char *)in_RSI);
  }
  return paVar1;
}

Assistant:

struct archive_wstring *
archive_wstrncat(struct archive_wstring *as, const wchar_t *p, size_t n)
{
	size_t s;
	const wchar_t *pp;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	if ((as = archive_wstring_append(as, p, s)) == NULL)
		__archive_errx(1, "Out of memory");
	return (as);
}